

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O0

void png_formatted_warning(png_const_structrp png_ptr,char (*p) [32],png_const_charp message)

{
  char *pcVar1;
  undefined1 *puVar2;
  size_t sVar3;
  bool bVar4;
  png_const_charp pend;
  png_const_charp parm;
  int parameter;
  int parameter_char;
  char msg [192];
  size_t i;
  png_const_charp message_local;
  char (*p_local) [32];
  png_const_structrp png_ptr_local;
  
  msg[0xb8] = '\0';
  msg[0xb9] = '\0';
  msg[0xba] = '\0';
  msg[0xbb] = '\0';
  msg[0xbc] = '\0';
  msg[0xbd] = '\0';
  msg[0xbe] = '\0';
  msg[0xbf] = '\0';
  i = (size_t)message;
  do {
    while( true ) {
      bVar4 = false;
      if ((ulong)msg._184_8_ < 0xbf) {
        bVar4 = *(char *)i != '\0';
      }
      if (!bVar4) {
        *(undefined1 *)((long)&parameter + msg._184_8_) = 0;
        png_warning(png_ptr,(png_const_charp)&parameter);
        return;
      }
      sVar3 = i;
      if (((p != (char (*) [32])0x0) && (*(char *)i == '@')) && (*(char *)(i + 1) != '\0')) break;
LAB_00125fc0:
      i = sVar3;
      puVar2 = (undefined1 *)((long)&parameter + msg._184_8_);
      msg._184_8_ = msg._184_8_ + 1;
      *puVar2 = *(undefined1 *)i;
      i = i + 1;
    }
    parm._0_4_ = 0;
    while( true ) {
      bVar4 = false;
      if ("123456789"[(int)parm] != *(char *)(i + 1)) {
        bVar4 = "123456789"[(int)parm] != '\0';
      }
      if (!bVar4) break;
      parm._0_4_ = (int)parm + 1;
    }
    sVar3 = i + 1;
    if (7 < (int)parm) goto LAB_00125fc0;
    pend = p[(int)parm];
    while( true ) {
      bVar4 = false;
      if (((ulong)msg._184_8_ < 0xbf) && (bVar4 = false, *pend != '\0')) {
        bVar4 = pend < p + (long)(int)parm + 1;
      }
      if (!bVar4) break;
      pcVar1 = (char *)((long)&parameter + msg._184_8_);
      msg._184_8_ = msg._184_8_ + 1;
      *pcVar1 = *pend;
      pend = pend + 1;
    }
    i = i + 2;
  } while( true );
}

Assistant:

void
png_formatted_warning(png_const_structrp png_ptr, png_warning_parameters p,
    png_const_charp message)
{
   /* The internal buffer is just 192 bytes - enough for all our messages,
    * overflow doesn't happen because this code checks!  If someone figures
    * out how to send us a message longer than 192 bytes, all that will
    * happen is that the message will be truncated appropriately.
    */
   size_t i = 0; /* Index in the msg[] buffer: */
   char msg[192];

   /* Each iteration through the following loop writes at most one character
    * to msg[i++] then returns here to validate that there is still space for
    * the trailing '\0'.  It may (in the case of a parameter) read more than
    * one character from message[]; it must check for '\0' and continue to the
    * test if it finds the end of string.
    */
   while (i<(sizeof msg)-1 && *message != '\0')
   {
      /* '@' at end of string is now just printed (previously it was skipped);
       * it is an error in the calling code to terminate the string with @.
       */
      if (p != NULL && *message == '@' && message[1] != '\0')
      {
         int parameter_char = *++message; /* Consume the '@' */
         static const char valid_parameters[] = "123456789";
         int parameter = 0;

         /* Search for the parameter digit, the index in the string is the
          * parameter to use.
          */
         while (valid_parameters[parameter] != parameter_char &&
            valid_parameters[parameter] != '\0')
            ++parameter;

         /* If the parameter digit is out of range it will just get printed. */
         if (parameter < PNG_WARNING_PARAMETER_COUNT)
         {
            /* Append this parameter */
            png_const_charp parm = p[parameter];
            png_const_charp pend = p[parameter] + (sizeof p[parameter]);

            /* No need to copy the trailing '\0' here, but there is no guarantee
             * that parm[] has been initialized, so there is no guarantee of a
             * trailing '\0':
             */
            while (i<(sizeof msg)-1 && *parm != '\0' && parm < pend)
               msg[i++] = *parm++;

            /* Consume the parameter digit too: */
            ++message;
            continue;
         }

         /* else not a parameter and there is a character after the @ sign; just
          * copy that.  This is known not to be '\0' because of the test above.
          */
      }

      /* At this point *message can't be '\0', even in the bad parameter case
       * above where there is a lone '@' at the end of the message string.
       */
      msg[i++] = *message++;
   }

   /* i is always less than (sizeof msg), so: */
   msg[i] = '\0';

   /* And this is the formatted message. It may be larger than
    * PNG_MAX_ERROR_TEXT, but that is only used for 'chunk' errors and these
    * are not (currently) formatted.
    */
   png_warning(png_ptr, msg);
}